

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkBitwiseToBool(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  TreeOp op;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *rhs;
  Expr *lhs;
  CheckerVisitor *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    op = Node::op((Node *)in_RSI);
    bVar1 = isBitwiseOperator(op);
    if (bVar1) {
      BinExpr::lhs(in_RSI);
      maybeEval(in_stack_ffffffffffffffe0,(Expr *)in_RDI,false);
      BinExpr::rhs(in_RSI);
      maybeEval(in_stack_ffffffffffffffe0,(Expr *)in_RDI,false);
      bVar1 = looksLikeBooleanExpr((Expr *)in_RDI);
      if ((bVar1) || (bVar1 = looksLikeBooleanExpr((Expr *)in_RDI), bVar1)) {
        report(in_RDI,(Node *)in_RSI,0x3c);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkBitwiseToBool(const BinExpr *bin) {

  if (effectsOnly)
    return;

  if (!isBitwiseOperator(bin->op()))
    return;

  const Expr *lhs = maybeEval(bin->lhs());
  const Expr *rhs = maybeEval(bin->rhs());

  if (looksLikeBooleanExpr(lhs) || looksLikeBooleanExpr(rhs)) {
    report(bin, DiagnosticsId::DI_BITWISE_OP_TO_BOOL);
  }

}